

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O1

QUuid __thiscall VcprojGenerator::getProjectUUID(VcprojGenerator *this,QString *filename)

{
  QMakeProject *pQVar1;
  storage_type *psVar2;
  undefined8 uVar3;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar4;
  QString string;
  QUuid QVar5;
  FILE *__stream;
  Data *pDVar6;
  ProString *pPVar7;
  qsizetype qVar8;
  long lVar9;
  CutResult CVar10;
  ProStringList *pPVar11;
  long lVar12;
  QArrayData *pQVar13;
  char16_t *pcVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  bool bVar16;
  bool bVar17;
  QAnyStringView QVar18;
  QByteArrayView QVar19;
  undefined1 auVar20 [16];
  undefined1 *puVar21;
  QArrayData *local_148 [3];
  QString local_130;
  ProString local_118;
  QArrayDataPointer<ProString> local_e8;
  ProKey local_c8;
  ProString local_98;
  QArrayDataPointer<ProString> local_68;
  int local_48;
  short sStack_44;
  ushort uStack_42;
  byte bStack_40;
  undefined7 uStack_3f;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = -0x55555556;
  sStack_44 = 0xaaaa;
  uStack_42 = 0xaaaa;
  bStack_40 = 0xaa;
  uStack_3f = 0xaaaaaaaaaaaaaa;
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey(&local_c8,"GUID");
  QMakeEvaluator::first(&local_98,&pQVar1->super_QMakeEvaluator,&local_c8);
  local_118.m_string.d.d = (Data *)(long)local_98.m_offset;
  pQVar13 = (QArrayData *)(long)local_98.m_length;
  CVar10 = QtPrivate::QContainerImplHelper::mid
                     (local_98.m_string.d.size,(qsizetype *)&local_118,
                      (qsizetype *)&stack0xfffffffffffffe88);
  uVar15 = (ulong)pQVar13 | 0x8000000000000000;
  aVar4.m_data_utf16 = local_98.m_string.d.ptr + (long)local_118.m_string.d.d;
  if (CVar10 == Null) {
    uVar15 = 0x8000000000000000;
    aVar4.m_data = (void *)0x0;
  }
  QVar18.m_size = uVar15;
  QVar18.field_0.m_data = aVar4.m_data;
  auVar20 = QUuid::fromString(QVar18);
  local_48 = auVar20._0_4_;
  sStack_44 = auVar20._4_2_;
  uStack_42 = auVar20._6_2_;
  bStack_40 = auVar20[8];
  uStack_3f = auVar20._9_7_;
  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_c8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bStack_40 == 0) {
    lVar9 = 9;
    do {
      lVar12 = lVar9;
      if (lVar12 == 0x10) goto LAB_002370ae;
      lVar9 = lVar12 + 1;
    } while (*(char *)((long)&local_48 + lVar12) == '\0');
    if (lVar12 - 9U < 7) goto LAB_0023707a;
LAB_002370ae:
    if (((local_48 != 0) || (sStack_44 != 0)) || (uStack_42 != 0)) goto LAB_0023707a;
LAB_002370ce:
    puVar21 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar13 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pcVar14 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    psVar2 = (storage_type *)(filename->d).size;
    if (psVar2 == (storage_type *)0x0) {
      pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey(&local_c8,"QMAKE_MAKEFILE");
      QMakeEvaluator::first(&local_98,&pQVar1->super_QMakeEvaluator,&local_c8);
      ProString::toQString((QString *)&local_68,&local_98);
    }
    else {
      local_68.d = (Data *)(filename->d).d;
      local_68.ptr = (ProString *)(filename->d).ptr;
      local_68.size = (qsizetype)psVar2;
      if ((QArrayData *)local_68.d != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((QArrayData *)local_68.d)->ref_)->ref_)._q_value.super___atomic_base<int>.
        _M_i = (((QArrayData *)&((QArrayData *)local_68.d)->ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    local_118.m_string.d.d = (Data *)local_68.d;
    local_118.m_string.d.ptr = (char16_t *)local_68.ptr;
    local_118.m_string.d.size = local_68.size;
    if (&(local_68.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    string.d.ptr = pcVar14;
    string.d.d = (Data *)pQVar13;
    string.d.size = (qsizetype)puVar21;
    Option::fixString((QString *)&stack0xfffffffffffffe88,string,(uchar)&local_118);
    if (&(local_118.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_118.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d)->super_QArrayData,2,0x10);
      }
    }
    if (psVar2 == (storage_type *)0x0) {
      if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_c8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_c8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    local_118.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_118.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_118.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::toUtf8_helper((QString *)&local_68);
    QVar19.m_data = (storage_type *)local_68.size;
    QVar19.m_size = (qsizetype)&local_118;
    QCryptographicHash::hash(QVar19,(Algorithm)local_68.ptr);
    if (&(local_68.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d)->super_QArrayData,1,0x10);
      }
    }
    pcVar14 = local_118.m_string.d.ptr;
    if (local_118.m_string.d.ptr == (char16_t *)0x0) {
      pcVar14 = (char16_t *)&QByteArray::_empty;
    }
    uVar3 = *(undefined8 *)pcVar14;
    local_48 = (int)uVar3;
    sStack_44 = (short)((ulong)uVar3 >> 0x20);
    uStack_42 = (ushort)((ulong)uVar3 >> 0x30);
    bStack_40 = (byte)*(undefined8 *)(pcVar14 + 4);
    uStack_3f = (undefined7)((ulong)*(undefined8 *)(pcVar14 + 4) >> 8);
    if (bStack_40 == 0) {
      lVar9 = 9;
      do {
        lVar12 = lVar9;
        if (lVar12 == 0x10) goto LAB_00237597;
        lVar9 = lVar12 + 1;
      } while (*(char *)((long)&local_48 + lVar12) == '\0');
      if (lVar12 - 9U < 7) goto LAB_0023727f;
LAB_00237597:
      bVar17 = false;
      if ((local_48 == 0) && (bVar17 = false, sStack_44 == 0)) {
        bVar17 = uStack_42 == 0;
      }
    }
    else {
LAB_0023727f:
      bVar17 = false;
    }
    bStack_40 = bStack_40 & 0x3f | 0x80;
    uStack_42 = uStack_42 & 0xfff | 0x3000;
    if (&(local_118.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_118.m_string.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  else {
LAB_0023707a:
    if ((filename->d).size != 0) goto LAB_002370ce;
    bVar17 = false;
  }
  if (bStack_40 == 0) {
    lVar9 = 9;
    do {
      lVar12 = lVar9;
      if (lVar12 == 0x10) goto LAB_002374de;
      lVar9 = lVar12 + 1;
    } while (*(char *)((long)&local_48 + lVar12) == '\0');
    if (6 < lVar12 - 9U) {
LAB_002374de:
      bVar16 = false;
      if ((local_48 == 0) && (sStack_44 == 0)) {
        bVar16 = uStack_42 == 0;
      }
      goto LAB_00237301;
    }
  }
  bVar16 = false;
LAB_00237301:
  if ((bool)(bVar17 | bVar16)) {
    auVar20 = QUuid::createUuid();
    __stream = _stderr;
    local_48 = auVar20._0_4_;
    sStack_44 = auVar20._4_2_;
    uStack_42 = auVar20._6_2_;
    bStack_40 = auVar20[8];
    uStack_3f = auVar20._9_7_;
    QUuid::toString((StringFormat)&local_68);
    QString::toUpper_helper((QString *)&stack0xfffffffffffffe88);
    QString::toLatin1_helper_inplace((QString *)&local_118);
    pcVar14 = local_118.m_string.d.ptr;
    if (local_118.m_string.d.ptr == (char16_t *)0x0) {
      pcVar14 = (char16_t *)&QByteArray::_empty;
    }
    fprintf(__stream,
            "qmake couldn\'t create a GUID based on filepath, and we couldn\'t\nfind a valid GUID in the .pro file (Consider adding\n\'GUID = %s\'  to the .pro file)\n"
            ,pcVar14);
    if (&(local_118.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_118.m_string.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
    if (&(local_68.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QUuid::toString((StringFormat)local_148);
  QString::toUpper_helper((QString *)&local_130);
  ProString::ProString(&local_118,&local_130);
  local_e8.d = (Data *)0x0;
  local_e8.ptr = (ProString *)0x0;
  local_e8.size = 0;
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
            ((QMovableArrayOps<ProString> *)&local_e8,0,&local_118);
  QList<ProString>::end((QList<ProString> *)&local_e8);
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&stack0xfffffffffffffe88,"GUID");
  pPVar11 = QMakeEvaluator::valuesRef
                      (&pQVar1->super_QMakeEvaluator,(ProKey *)&stack0xfffffffffffffe88);
  qVar8 = local_e8.size;
  pPVar7 = local_e8.ptr;
  pDVar6 = local_e8.d;
  local_e8.d = (Data *)0x0;
  local_e8.ptr = (ProString *)0x0;
  local_e8.size = 0;
  local_68.d = (pPVar11->super_QList<ProString>).d.d;
  local_68.ptr = (pPVar11->super_QList<ProString>).d.ptr;
  (pPVar11->super_QList<ProString>).d.d = pDVar6;
  (pPVar11->super_QList<ProString>).d.ptr = pPVar7;
  local_68.size = (pPVar11->super_QList<ProString>).d.size;
  (pPVar11->super_QList<ProString>).d.size = qVar8;
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_68);
  if (pQVar13 != (QArrayData *)0x0) {
    LOCK();
    (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar13,2,0x10);
    }
  }
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_e8);
  if (&(local_118.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_118.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_130.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_130.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_130.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_130.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_130.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_148[0] != (QArrayData *)0x0) {
    LOCK();
    (local_148[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_148[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_148[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_148[0],2,0x10);
    }
  }
  QVar5.data2 = sStack_44;
  QVar5.data1 = local_48;
  QVar5.data3 = uStack_42;
  QVar5.data4[0] = bStack_40;
  QVar5.data4[1] = (undefined1)uStack_3f;
  QVar5.data4[2] = uStack_3f._1_1_;
  QVar5.data4[3] = uStack_3f._2_1_;
  QVar5.data4[4] = uStack_3f._3_1_;
  QVar5.data4[5] = uStack_3f._4_1_;
  QVar5.data4[6] = uStack_3f._5_1_;
  QVar5.data4[7] = uStack_3f._6_1_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

QUuid VcprojGenerator::getProjectUUID(const QString &filename)
{
    bool validUUID = true;

    // Read GUID from variable-space
    auto uuid = QUuid::fromString(project->first("GUID").toQStringView());

    // If none, create one based on the MD5 of absolute project path
    if(uuid.isNull() || !filename.isEmpty()) {
        QString abspath = Option::fixPathToTargetOS(
                    filename.isEmpty() ? project->first("QMAKE_MAKEFILE").toQString() : filename);
        QByteArray digest = QCryptographicHash::hash(abspath.toUtf8(), QCryptographicHash::Sha1);
        memcpy((unsigned char*)(&uuid), digest.constData(), sizeof(QUuid));
        validUUID = !uuid.isNull();
        uuid.data4[0] = (uuid.data4[0] & 0x3F) | 0x80; // UV_DCE variant
        uuid.data3 = (uuid.data3 & 0x0FFF) | (QUuid::Name<<12);
    }

    // If still not valid, generate new one, and suggest adding to .pro
    if(uuid.isNull() || !validUUID) {
        uuid = QUuid::createUuid();
        fprintf(stderr,
                "qmake couldn't create a GUID based on filepath, and we couldn't\nfind a valid GUID in the .pro file (Consider adding\n'GUID = %s'  to the .pro file)\n",
                uuid.toString().toUpper().toLatin1().constData());
    }

    // Store GUID in variable-space
    project->values("GUID") = ProStringList(uuid.toString().toUpper());
    return uuid;
}